

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setconsttable(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  undefined1 local_28 [8];
  SQObject o;
  HSQUIRRELVM v_local;
  
  o._unVal = (SQObjectValue)v;
  pSVar1 = stack_get(v,-1);
  local_28._0_4_ = (pSVar1->super_SQObject)._type;
  local_28._4_4_ = *(undefined4 *)&(pSVar1->super_SQObject).field_0x4;
  o._0_8_ = (pSVar1->super_SQObject)._unVal;
  if (local_28._0_4_ == OT_TABLE) {
    SQObjectPtr::operator=(&(o._unVal.pThread)->_sharedstate->_consts,(SQObject *)local_28);
    SQVM::Pop(o._unVal.pThread);
    v_local = (HSQUIRRELVM)0x0;
  }
  else {
    v_local = (HSQUIRRELVM)
              sq_throwerror((HSQUIRRELVM)o._unVal.pTable,"invalid type, expected table");
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_setconsttable(HSQUIRRELVM v)
{
    SQObject o = stack_get(v, -1);
    if(sq_istable(o)) {
        _ss(v)->_consts = o;
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type, expected table"));
}